

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O3

ostream * rlib::operator<<(ostream *os,JsonT<void> *json)

{
  Format local_88;
  Stringify local_28;
  
  JsonT<void>::Stringify::Format::Format(&local_88);
  local_28.json = json;
  local_28.format = &local_88;
  operator<<(os,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.colon._M_dataplus._M_p != &local_88.colon.field_2) {
    operator_delete(local_88.colon._M_dataplus._M_p,local_88.colon.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.indent._M_dataplus._M_p != &local_88.indent.field_2) {
    operator_delete(local_88.indent._M_dataplus._M_p,
                    local_88.indent.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.lf._M_dataplus._M_p != &local_88.lf.field_2) {
    operator_delete(local_88.lf._M_dataplus._M_p,local_88.lf.field_2._M_allocated_capacity + 1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const JsonT& json) {
			os << Stringify(json, typename Stringify::Format());
			return os;
		}